

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O1

void __thiscall
CommandDrawSelectedInventory::Draw
          (CommandDrawSelectedInventory *this,SBarInfoMainBlock *block,DSBarInfo *statusBar)

{
  bool bVar1;
  SBarInfoCommand **ppSVar2;
  long *plVar3;
  APlayerPawn *pAVar4;
  AInventory *pAVar5;
  FTexture *pFVar6;
  long lVar7;
  ulong uVar8;
  double Alpha;
  
  if (this->alternateOnEmpty == true) {
    bVar1 = (this->super_CommandDrawImage).super_SBarInfoCommandFlowControl.truth;
    uVar8 = (ulong)(this->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[bVar1].
                   super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count;
    if (uVar8 != 0) {
      ppSVar2 = (this->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[bVar1].
                super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array;
      lVar7 = 0;
      do {
        plVar3 = *(long **)((long)ppSVar2 + lVar7);
        (**(code **)(*plVar3 + 0x10))(plVar3,block,statusBar);
        lVar7 = lVar7 + 8;
      } while (uVar8 << 3 != lVar7);
    }
  }
  pAVar4 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
  pAVar5 = (pAVar4->InvSel).field_0.p;
  if (pAVar5 != (AInventory *)0x0) {
    if (((pAVar5->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
      if (((byte)level.flags & 2) == 0) {
        if ((artiflashTick != 0 & this->artiflash) == 1) {
          pFVar6 = FImageCollection::operator[]
                             (&statusBar->Images,(statusBar->invBarOffset - artiflashTick) + 10);
          DSBarInfo::DrawGraphic
                    (statusBar,pFVar6,(this->super_CommandDrawImage).imgx,
                     (this->super_CommandDrawImage).imgy,block->xOffset,block->yOffset,
                     block->currentAlpha,block->fullScreenOffsets,
                     (bool)(this->super_CommandDrawImage).super_SBarInfoCommandFlowControl.
                           field_0x31,false,(this->super_CommandDrawImage).offset,false,-1);
        }
        else {
          if (this->itemflash == true) {
            if ((itemflashFade != 0.0) || (NAN(itemflashFade))) {
              Alpha = itemflashFade * block->currentAlpha;
              pFVar6 = FImageCollection::operator[](&statusBar->Images,statusBar->invBarOffset + 2);
              DSBarInfo::DrawGraphic
                        (statusBar,pFVar6,
                         (SBarInfoCoordinate)((int)(this->super_CommandDrawImage).imgx + -8),
                         (SBarInfoCoordinate)((int)(this->super_CommandDrawImage).imgy + 4),
                         block->xOffset,block->yOffset,Alpha,block->fullScreenOffsets,
                         (bool)(this->super_CommandDrawImage).super_SBarInfoCommandFlowControl.
                               field_0x31,false,(this->super_CommandDrawImage).offset,false,-1);
            }
          }
          CommandDrawImage::Draw(&this->super_CommandDrawImage,block,statusBar);
        }
        if ((this->alwaysShowCounter != false) ||
           (((((statusBar->super_DBaseStatusBar).CPlayer)->mo->InvSel).field_0.p)->Amount != 1)) {
          CommandDrawString::Draw
                    (&(this->super_CommandDrawNumber).super_CommandDrawString,block,statusBar);
          return;
        }
      }
    }
    else {
      (pAVar4->InvSel).field_0.p = (AInventory *)0x0;
    }
  }
  return;
}

Assistant:

void	Draw(const SBarInfoMainBlock *block, const DSBarInfo *statusBar)
		{
			if(alternateOnEmpty)
				SBarInfoCommandFlowControl::Draw(block, statusBar);

			if(statusBar->CPlayer->mo->InvSel != NULL && !(level.flags & LEVEL_NOINVENTORYBAR))
			{
				if(artiflash && artiflashTick)
				{
					statusBar->DrawGraphic(statusBar->Images[ARTIFLASH_OFFSET+(4-artiflashTick)], imgx, imgy, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets(),
						translatable, false, offset);
				}
				else
				{
					if(itemflash && itemflashFade != 0)
					{
						double flashAlpha = block->Alpha() * itemflashFade;
						statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgCURSOR], imgx-4, imgy+2, block->XOffset(), block->YOffset(), flashAlpha, block->FullScreenOffsets(),
							translatable, false, offset);
					}
					CommandDrawImage::Draw(block, statusBar);
				}
				if(alwaysShowCounter || statusBar->CPlayer->mo->InvSel->Amount != 1)
					CommandDrawNumber::Draw(block, statusBar);
			}
		}